

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O0

void linfren(lindef *lin,objnum oldnum,objnum newnum)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ushort in_DX;
  ushort in_SI;
  long in_RDI;
  int tot;
  int pgtot;
  int i;
  mcmon *pgobjn;
  uchar *objp;
  uint pgcnt;
  mcmon in_stack_ffffffffffffffce;
  int iVar4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  ushort *local_20;
  uchar *local_18;
  int local_10;
  
  iVar2 = (int)*(undefined8 *)(in_RDI + 0x260);
  if (iVar2 != 0) {
    local_20 = (ushort *)(in_RDI + 0x160);
    for (local_10 = (iVar2 + -1 >> 10) + 1; local_10 != 0; local_10 = local_10 + -1) {
      local_18 = mcmlck((mcmcxdef *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (mcmon)((uint)iVar2 >> 0x10));
      iVar4 = iVar2;
      if (0x400 < iVar2) {
        iVar4 = 0x400;
      }
      in_stack_ffffffffffffffdc = 0;
      in_stack_ffffffffffffffd8 = iVar4;
      while( true ) {
        if (in_stack_ffffffffffffffd8 <= in_stack_ffffffffffffffdc) break;
        uVar1 = osrp2(local_18);
        if (uVar1 == in_SI) {
          oswp2(local_18,(uint)in_DX);
        }
        in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + 1;
        local_18 = local_18 + 4;
      }
      lVar3 = *(long *)(*(long *)**(undefined8 **)(in_RDI + 0x158) +
                       (long)((int)(uint)*(ushort *)
                                          (*(long *)(*(long *)(in_RDI + 0x158) + 0x30 +
                                                    (long)((int)(uint)*local_20 >> 8) * 8) +
                                          (long)(int)(*local_20 & 0xff) * 2) >> 8) * 8) +
              (long)(int)(*(ushort *)
                           (*(long *)(*(long *)(in_RDI + 0x158) + 0x30 +
                                     (long)((int)(uint)*local_20 >> 8) * 8) +
                           (long)(int)(*local_20 & 0xff) * 2) & 0xff) * 0x20;
      *(ushort *)(lVar3 + 0x14) = *(ushort *)(lVar3 + 0x14) | 1;
      mcmunlck((mcmcxdef *)CONCAT26((short)((uint)iVar2 >> 0x10),CONCAT24((short)iVar2,iVar4)),
               in_stack_ffffffffffffffce);
      local_20 = local_20 + 1;
      iVar2 = iVar2 + -0x400;
    }
  }
  return;
}

Assistant:

void linfren(lindef *lin, objnum oldnum, objnum newnum)
{
#   define  linf ((linfdef *)lin)
    uint    pgcnt;
    uchar  *objp;
    mcmon  *pgobjn;
    int     i;
    int     pgtot;
    int     tot;

    /* figure the number of pages - if no lines, stop now */
    tot = linf->linfcrec;
    if (tot == 0)
        return;

    /* calculate the number of pages to check */
    pgcnt = 1 + ((tot - 1) >> 10);

    /* scan each page */
    for (pgobjn = linf->linfpg ; pgcnt ; ++pgobjn, --pgcnt, tot -= 1024)
    {
        /* lock the page */
        objp = mcmlck(linf->linfmem, *pgobjn);

        /* figure the number on this page */
        pgtot = (tot > 1024 ? 1024 : tot);

        /* scan each record on this page */
        for (i = 0 ; i < pgtot ; ++i, objp += DBGLINFSIZ)
        {
            /* check this one */
            if (osrp2(objp) == oldnum)
            {
                /* it matches - renumber it */
                oswp2(objp, newnum);
            }
        }

        /* done with the page - touch it and unlock it */
        mcmtch(linf->linfmem, *pgobjn);
        mcmunlck(linf->linfmem, *pgobjn);
    }

#   undef  linf
}